

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

bool extractLine(string *line,string *text,int width,bool hyphenate,uint *offset)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  wchar_t ucs;
  int iVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  int iVar10;
  size_type bytes;
  undefined4 local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar6 = (ulong)*offset;
  uVar3 = text->_M_string_length;
  if (uVar6 < uVar3) {
    local_74 = (undefined4)CONCAT71(in_register_00000009,hyphenate);
    iVar10 = 0;
    uVar7 = 0;
    sVar9 = uVar6;
    bytes = uVar6;
    do {
      do {
        uVar8 = sVar9;
        sVar9 = bytes;
        ucs = utf8_next_char(text,&bytes);
        if (ucs == L' ') {
          uVar7 = sVar9 & 0xffffffff;
        }
        else if ((ucs == L'\n') || (ucs == L'\0')) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
          std::__cxx11::string::operator=((string *)line,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          sVar9 = bytes & 0xffffffff;
          goto LAB_00138f0f;
        }
        iVar5 = mk_wcwidth(ucs);
        iVar10 = iVar10 + iVar5;
      } while (iVar10 <= width);
      pcVar4 = (text->_M_dataplus)._M_p;
      cVar1 = pcVar4[uVar8];
      cVar2 = pcVar4[sVar9];
      if ((cVar1 != ' ') && (cVar2 == ' ')) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        sVar9 = (size_type)((int)sVar9 + 1);
LAB_00138e31:
        sVar9 = sVar9 & 0xffffffff;
        goto LAB_00138f0f;
      }
      iVar5 = (int)uVar7;
      if ((cVar1 == ' ') && ((cVar2 != ' ' && (iVar5 != 0)))) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_00138e31;
      }
    } while ((cVar1 == ' ') || (cVar2 == ' '));
    if (iVar5 == 0) {
      if ((char)local_74 == '\0') {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
        std::operator+(&local_70,&local_50,'-');
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        sVar9 = uVar8;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      sVar9 = (ulong)(iVar5 + 1);
    }
LAB_00138f0f:
    *offset = (uint)sVar9;
  }
  return uVar6 < uVar3;
}

Assistant:

bool extractLine (
  std::string& line,
  const std::string& text,
  int width,
  bool hyphenate,
  unsigned int& offset)
{
  // Terminate processing.
  // Note: bytes vs bytes.
  if (offset >= text.length ())
    return false;

  std::string::size_type last_last_bytes = offset;
  std::string::size_type last_bytes = offset;
  std::string::size_type bytes = offset;
  unsigned int last_ws = 0;
  int character;
  int char_width = 0;
  int line_width = 0;
  while (1)
  {
    last_last_bytes = last_bytes;
    last_bytes = bytes;
    character = utf8_next_char (text, bytes);

    if (character == 0 ||
        character == '\n')
    {
      line = text.substr (offset, last_bytes - offset);
      offset = bytes;
      break;
    }
    else if (character == ' ')
      last_ws = last_bytes;

    char_width = mk_wcwidth (character);
    if (line_width + char_width > width)
    {
      int last_last_character = text[last_last_bytes];
      int last_character = text[last_bytes];

      // [case 1] one| two --> last_last != 32, last == 32, ws == 0
      if (last_last_character != ' ' &&
          last_character      == ' ')
      {
        line = text.substr (offset, last_bytes - offset);
        offset = last_bytes + 1;
        break;
      }

      // [case 2] one |two --> last_last == 32, last != 32, ws != 0
      else if (last_last_character == ' ' &&
               last_character      != ' ' &&
               last_ws             != 0)
      {
        line = text.substr (offset, last_bytes - offset - 1);
        offset = last_bytes;
        break;
      }

      else if (last_last_character != ' ' &&
               last_character      != ' ')
      {
        // [case 3] one t|wo --> last_last != 32, last != 32, ws != 0
        if (last_ws != 0)
        {
          line = text.substr (offset, last_ws - offset);
          offset = last_ws + 1;
          break;
        }
        // [case 4] on|e two --> last_last != 32, last != 32, ws == 0
        else
        {
          if (hyphenate)
          {
            line = text.substr (offset, last_bytes - offset - 1) + '-';
            offset = last_last_bytes;
          }
          else
          {
            line = text.substr (offset, last_bytes - offset);
            offset = last_bytes;
          }
        }

        break;
      }
    }

    line_width += char_width;
  }

  return true;
}